

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O3

void __thiscall
addrman_tests::addrman_select_by_network::test_method(addrman_select_by_network *this)

{
  readonly_property<bool> rVar1;
  readonly_property<bool> rVar2;
  readonly_property<bool> rVar3;
  _Head_base<0UL,_AddrMan_*,_false> _Var4;
  bool bVar5;
  bool bVar6;
  int32_t consistency_check_ratio;
  AddrMan *this_00;
  time_point tVar7;
  iterator in_R8;
  iterator pvVar8;
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var9;
  undefined ***pppuVar10;
  iterator in_R9;
  iterator pvVar11;
  uint uVar12;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<CAddress> __l;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  initializer_list<CAddress> __l_00;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  initializer_list<CAddress> __l_01;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  nets_without_entries;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  nets_with_entries;
  __single_object addrman;
  check_type cVar13;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  undefined1 local_729;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 local_691;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 local_599;
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_598;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_4a0;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  _Head_base<0UL,_AddrMan_*,_false> local_208;
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_200;
  undefined4 local_1c4;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [24];
  direct_or_indirect local_198;
  undefined1 auStack_188 [16];
  uint16_t local_178;
  duration local_170;
  __node_base_ptr p_Stack_168;
  direct_or_indirect local_158;
  __node_base _Stack_148;
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_140;
  uint16_t local_138;
  duration local_130;
  __node_base_ptr p_Stack_128;
  direct_or_indirect local_120;
  uint local_110;
  Network local_108;
  uint32_t uStack_104;
  uint16_t local_100;
  direct_or_indirect local_f8;
  uint local_e8;
  Network local_e0;
  uint32_t uStack_dc;
  uint16_t local_d8;
  direct_or_indirect local_d0;
  uint local_c0;
  direct_or_indirect local_b0;
  __node_base local_a0;
  undefined ***pppuStack_98;
  _Prime_rehash_policy local_90;
  __node_base_ptr p_Stack_80;
  direct_or_indirect local_78;
  undefined1 *local_68 [2];
  uint16_t local_58;
  NodeSeconds local_50;
  __node_base_ptr p_Stack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  consistency_check_ratio =
       GetCheckRatio((NodeContext *)(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.args);
  this_00 = (AddrMan *)operator_new(8);
  AddrMan::AddrMan(this_00,&EMPTY_NETGROUPMAN,true,consistency_check_ratio);
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xc7;
  file.m_begin = (iterator)&local_218;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  local_208._M_head_impl = this_00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_228,msg);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_198._0_4_ = 1;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_b0,&local_198,(long)local_198.direct + 4,0,&local_200,&local_f8,&local_d0);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar5 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_598._M_buckets = (__buckets_ptr)CONCAT71(local_598._M_buckets._1_7_,!bVar5);
  local_598._M_bucket_count = 0;
  local_598._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_158.indirect_contents.indirect = "!addrman->Select( true, {NET_IPV4}).first.IsValid()";
  local_158._8_8_ = (long)"!addrman->Select( true, {NET_IPV4}).first.IsValid()" + 0x33;
  local_4a0._M_bucket_count = local_4a0._M_bucket_count & 0xffffffffffffff00;
  local_4a0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_4a0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_230 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_4a0._M_element_count = (size_type)&local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_598,(lazy_ostream *)&local_4a0,1,0,WARN,_cVar13,
             (size_t)&local_238,199);
  boost::detail::shared_count::~shared_count((shared_count *)&local_598._M_before_begin);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xc8;
  file_00.m_begin = (iterator)&local_248;
  msg_00.m_end = pvVar11;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_258,
             msg_00);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_198._0_4_ = 1;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_b0,&local_198,(long)local_198.direct + 4,0,&local_200,&local_f8,&local_d0);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar5 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_598._M_buckets = (__buckets_ptr)CONCAT71(local_598._M_buckets._1_7_,!bVar5);
  local_598._M_bucket_count = 0;
  local_598._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_158.indirect_contents.indirect = "!addrman->Select( false, {NET_IPV4}).first.IsValid()";
  local_158._8_8_ = (long)"!addrman->Select( false, {NET_IPV4}).first.IsValid()" + 0x34;
  local_4a0._M_bucket_count = local_4a0._M_bucket_count & 0xffffffffffffff00;
  local_4a0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_4a0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_260 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_4a0._M_element_count = (size_type)&local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_598,(lazy_ostream *)&local_4a0,1,0,WARN,_cVar13,
             (size_t)&local_268,200);
  boost::detail::shared_count::~shared_count((shared_count *)&local_598._M_before_begin);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  local_78.indirect_contents.indirect =
       (char *)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"252.2.2.2","");
  ResolveIP((CNetAddr *)&local_d0.indirect_contents,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68) {
    operator_delete(local_78.indirect_contents.indirect,(long)local_68[0] + 1);
  }
  local_78.indirect_contents.indirect =
       (char *)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"250.1.1.1","");
  ResolveService((CService *)&local_f8.indirect_contents,(string *)&local_78,0x208d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68) {
    operator_delete(local_78.indirect_contents.indirect,(long)local_68[0] + 1);
  }
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xcd;
  file_01.m_begin = (iterator)&local_278;
  msg_01.m_end = pvVar11;
  msg_01.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_288,
             msg_01);
  _Var4._M_head_impl = local_208._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_120.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents);
  local_108 = local_e0;
  uStack_104 = uStack_dc;
  local_100 = local_d8;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_120.indirect_contents);
  local_68[1] = (undefined1 *)_local_108;
  local_58 = local_100;
  local_50.__d.__r = (duration)100000000;
  p_Stack_48 = (__node_base_ptr)0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_598,__l,
             (allocator_type *)&local_198);
  bVar5 = AddrMan::Add(_Var4._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)&local_598,
                       (CNetAddr *)&local_d0.indirect_contents,(seconds)0x0);
  local_4a0._M_buckets = (__buckets_ptr)CONCAT71(local_4a0._M_buckets._1_7_,bVar5);
  local_4a0._M_bucket_count = 0;
  local_4a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_158.indirect_contents.indirect = "addrman->Add({CAddress(addr1, NODE_NONE)}, source)";
  local_158._8_8_ = (long)"addrman->Add({CAddress(addr1, NODE_NONE)}, source)" + 0x32;
  local_b0._8_8_ = local_b0._8_8_ & 0xffffffffffffff00;
  local_b0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
  local_a0._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_290 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  pppuStack_98 = (undefined ***)&local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_4a0,(lazy_ostream *)&local_b0,1,0,WARN,_cVar13,
             (size_t)&local_298,0xcd);
  boost::detail::shared_count::~shared_count((shared_count *)&local_4a0._M_before_begin);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_598);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_110) {
    free(local_120.indirect_contents.indirect);
    local_120.indirect_contents.indirect = (char *)0x0;
  }
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xcf;
  file_02.m_begin = (iterator)&local_2a8;
  msg_02.m_end = pvVar11;
  msg_02.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2b8,
             msg_02);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_198._0_4_ = 1;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_b0,&local_198,(long)local_198.direct + 4,0,&local_200,local_1b0,local_1c0);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar5 = ::operator==((CService *)&local_78,(CService *)&local_f8.indirect_contents);
  local_598._M_buckets = (__buckets_ptr)CONCAT71(local_598._M_buckets._1_7_,bVar5);
  local_598._M_bucket_count = 0;
  local_598._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_158.indirect_contents.indirect = "addrman->Select( true, {NET_IPV4}).first == addr1";
  local_158._8_8_ = (long)"addrman->Select( true, {NET_IPV4}).first == addr1" + 0x31;
  local_4a0._M_bucket_count = local_4a0._M_bucket_count & 0xffffffffffffff00;
  local_4a0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_4a0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2c0 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_4a0._M_element_count = (size_type)&local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_598,(lazy_ostream *)&local_4a0,1,0,WARN,_cVar13,
             (size_t)&local_2c8,0xcf);
  boost::detail::shared_count::~shared_count((shared_count *)&local_598._M_before_begin);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xd0;
  file_03.m_begin = (iterator)&local_2d8;
  msg_03.m_end = pvVar11;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2e8,
             msg_03);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_198._0_4_ = 1;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_b0,&local_198,(long)local_198.direct + 4,0,&local_200,local_1b0,local_1c0);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar5 = ::operator==((CService *)&local_78,(CService *)&local_f8.indirect_contents);
  local_598._M_buckets = (__buckets_ptr)CONCAT71(local_598._M_buckets._1_7_,bVar5);
  local_598._M_bucket_count = 0;
  local_598._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_158.indirect_contents.indirect = "addrman->Select( false, {NET_IPV4}).first == addr1";
  local_158._8_8_ = (long)"addrman->Select( false, {NET_IPV4}).first == addr1" + 0x32;
  local_4a0._M_bucket_count = local_4a0._M_bucket_count & 0xffffffffffffff00;
  local_4a0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_4a0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2f0 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_4a0._M_element_count = (size_type)&local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_598,(lazy_ostream *)&local_4a0,1,0,WARN,_cVar13,
             (size_t)&local_2f8,0xd0);
  boost::detail::shared_count::~shared_count((shared_count *)&local_598._M_before_begin);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xd1;
  file_04.m_begin = (iterator)&local_308;
  msg_04.m_end = pvVar11;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_318,
             msg_04);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_198._0_4_ = 2;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_b0,&local_198,(long)local_198.direct + 4,0,&local_200,local_1b0,local_1c0);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar5 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_598._M_buckets = (__buckets_ptr)CONCAT71(local_598._M_buckets._1_7_,!bVar5);
  local_598._M_bucket_count = 0;
  local_598._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_158.indirect_contents.indirect = "!addrman->Select( false, {NET_IPV6}).first.IsValid()";
  local_158._8_8_ = (long)"!addrman->Select( false, {NET_IPV6}).first.IsValid()" + 0x34;
  local_4a0._M_bucket_count = local_4a0._M_bucket_count & 0xffffffffffffff00;
  local_4a0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_4a0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_320 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_4a0._M_element_count = (size_type)&local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_598,(lazy_ostream *)&local_4a0,1,0,WARN,_cVar13,
             (size_t)&local_328,0xd1);
  boost::detail::shared_count::~shared_count((shared_count *)&local_598._M_before_begin);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xd2;
  file_05.m_begin = (iterator)&local_338;
  msg_05.m_end = pvVar11;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_348,
             msg_05);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_198._0_4_ = 3;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_b0,&local_198,(long)local_198.direct + 4,0,&local_200,local_1b0,local_1c0);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar5 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_598._M_buckets = (__buckets_ptr)CONCAT71(local_598._M_buckets._1_7_,!bVar5);
  local_598._M_bucket_count = 0;
  local_598._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_158.indirect_contents.indirect = "!addrman->Select( false, {NET_ONION}).first.IsValid()";
  local_158._8_8_ = (long)"!addrman->Select( false, {NET_ONION}).first.IsValid()" + 0x35;
  local_4a0._M_bucket_count = local_4a0._M_bucket_count & 0xffffffffffffff00;
  local_4a0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_4a0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_350 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_4a0._M_element_count = (size_type)&local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_598,(lazy_ostream *)&local_4a0,1,0,WARN,_cVar13,
             (size_t)&local_358,0xd2);
  boost::detail::shared_count::~shared_count((shared_count *)&local_598._M_before_begin);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xd3;
  file_06.m_begin = (iterator)&local_368;
  msg_06.m_end = pvVar11;
  msg_06.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_378,
             msg_06);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_198._0_4_ = 4;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_b0,&local_198,(long)local_198.direct + 4,0,&local_200,local_1b0,local_1c0);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar5 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_598._M_buckets = (__buckets_ptr)CONCAT71(local_598._M_buckets._1_7_,!bVar5);
  local_598._M_bucket_count = 0;
  local_598._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_158.indirect_contents.indirect = "!addrman->Select( false, {NET_I2P}).first.IsValid()";
  local_158._8_8_ = (long)"!addrman->Select( false, {NET_I2P}).first.IsValid()" + 0x33;
  local_4a0._M_bucket_count = local_4a0._M_bucket_count & 0xffffffffffffff00;
  local_4a0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_4a0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_380 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_4a0._M_element_count = (size_type)&local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_598,(lazy_ostream *)&local_4a0,1,0,WARN,_cVar13,
             (size_t)&local_388,0xd3);
  boost::detail::shared_count::~shared_count((shared_count *)&local_598._M_before_begin);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xd4;
  file_07.m_begin = (iterator)&local_398;
  msg_07.m_end = pvVar11;
  msg_07.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3a8,
             msg_07);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_198._0_4_ = 5;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_b0,&local_198,(long)local_198.direct + 4,0,&local_200,local_1b0,local_1c0);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar5 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_598._M_buckets = (__buckets_ptr)CONCAT71(local_598._M_buckets._1_7_,!bVar5);
  local_598._M_bucket_count = 0;
  local_598._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_158.indirect_contents.indirect = "!addrman->Select( false, {NET_CJDNS}).first.IsValid()";
  local_158._8_8_ = (long)"!addrman->Select( false, {NET_CJDNS}).first.IsValid()" + 0x35;
  local_4a0._M_bucket_count = local_4a0._M_bucket_count & 0xffffffffffffff00;
  local_4a0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_4a0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3b0 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_4a0._M_element_count = (size_type)&local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_598,(lazy_ostream *)&local_4a0,1,0,WARN,_cVar13,
             (size_t)&local_3b8,0xd4);
  boost::detail::shared_count::~shared_count((shared_count *)&local_598._M_before_begin);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xd5;
  file_08.m_begin = (iterator)&local_3c8;
  msg_08.m_end = pvVar11;
  msg_08.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3d8,
             msg_08);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_198._0_4_ = 5;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_b0,&local_198,(long)local_198.direct + 4,0,&local_200,local_1b0,local_1c0);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar5 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_598._M_buckets = (__buckets_ptr)CONCAT71(local_598._M_buckets._1_7_,!bVar5);
  local_598._M_bucket_count = 0;
  local_598._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_158.indirect_contents.indirect = "!addrman->Select( true, {NET_CJDNS}).first.IsValid()";
  local_158._8_8_ = (long)"!addrman->Select( true, {NET_CJDNS}).first.IsValid()" + 0x34;
  local_4a0._M_bucket_count = local_4a0._M_bucket_count & 0xffffffffffffff00;
  local_4a0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_4a0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3e0 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_4a0._M_element_count = (size_type)&local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_598,(lazy_ostream *)&local_4a0,1,0,WARN,_cVar13,
             (size_t)&local_3e8,0xd5);
  boost::detail::shared_count::~shared_count((shared_count *)&local_598._M_before_begin);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xd6;
  file_09.m_begin = (iterator)&local_3f8;
  msg_09.m_end = pvVar11;
  msg_09.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_408,
             msg_09);
  local_b0.indirect_contents.indirect = (char *)&p_Stack_80;
  local_b0._8_8_ = 1;
  local_a0._M_nxt = (_Hash_node_base *)0x0;
  pppuStack_98 = (undefined ***)0x0;
  local_90._M_max_load_factor = 1.0;
  local_90._4_4_ = 0;
  local_90._M_next_resize = 0;
  p_Stack_80 = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,local_208._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_b0);
  bVar5 = ::operator==((CService *)&local_78,(CService *)&local_f8.indirect_contents);
  local_598._M_buckets = (__buckets_ptr)CONCAT71(local_598._M_buckets._1_7_,bVar5);
  local_598._M_bucket_count = 0;
  local_598._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_158.indirect_contents.indirect = "addrman->Select( false).first == addr1";
  local_158._8_8_ = (long)"addrman->Select( false).first == addr1" + 0x26;
  local_4a0._M_bucket_count = local_4a0._M_bucket_count & 0xffffffffffffff00;
  local_4a0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_4a0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_410 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_4a0._M_element_count = (size_type)&local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_598,(lazy_ostream *)&local_4a0,1,0,WARN,_cVar13,
             (size_t)&local_418,0xd6);
  boost::detail::shared_count::~shared_count((shared_count *)&local_598._M_before_begin);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  CService::CService((CService *)&local_b0);
  local_90._M_next_resize = 100000000;
  p_Stack_80 = (__node_base_ptr)0x0;
  local_78.indirect_contents.indirect =
       (char *)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.i2p","");
  CNetAddr::SetSpecial((CNetAddr *)&local_b0,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68) {
    operator_delete(local_78.indirect_contents.indirect,(long)local_68[0] + 1);
  }
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xdb;
  file_10.m_begin = (iterator)&local_428;
  msg_10.m_end = pvVar11;
  msg_10.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_438,
             msg_10);
  _Var4._M_head_impl = local_208._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b0);
  local_68[1] = (undefined1 *)pppuStack_98;
  local_58 = local_90._M_max_load_factor._0_2_;
  local_50.__d.__r = (duration)(duration)local_90._M_next_resize;
  p_Stack_48 = p_Stack_80;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_158,__l_00,
             (allocator_type *)&local_200);
  bVar5 = AddrMan::Add(_Var4._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)&local_158,
                       (CNetAddr *)&local_d0.indirect_contents,(seconds)0x0);
  local_598._M_buckets = (__buckets_ptr)CONCAT71(local_598._M_buckets._1_7_,bVar5);
  local_598._M_bucket_count = 0;
  local_598._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_198.indirect_contents.indirect = "addrman->Add({i2p_addr}, source)";
  local_198._8_8_ = (long)"addrman->Add({i2p_addr}, source)" + 0x20;
  local_4a0._M_bucket_count = local_4a0._M_bucket_count & 0xffffffffffffff00;
  local_4a0._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_4a0._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_440 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_4a0._M_element_count = (size_type)&local_198;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_598,(lazy_ostream *)&local_4a0,1,0,WARN,_cVar13,
             (size_t)&local_448,0xdb);
  boost::detail::shared_count::~shared_count((shared_count *)&local_598._M_before_begin);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_158);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
  }
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xdd;
  file_11.m_begin = (iterator)&local_458;
  msg_11.m_end = pvVar11;
  msg_11.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_468,
             msg_11);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_200._M_buckets = (__buckets_ptr)CONCAT44(local_200._M_buckets._4_4_,4);
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_4a0,&local_200,(undefined1 *)((long)&local_200._M_buckets + 4),0,local_1b0,
             local_1c0,&local_1c4);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_4a0);
  if ((local_50.__d.__r == (duration)local_90._M_next_resize) && (p_Stack_48 == p_Stack_80)) {
    bVar5 = ::operator==((CService *)&local_78,(CService *)&local_b0);
  }
  else {
    bVar5 = false;
  }
  local_158.direct[0] = bVar5;
  local_158._8_8_ = (element_type *)0x0;
  _Stack_148._M_nxt = (_Hash_node_base *)0x0;
  local_198.indirect_contents.indirect = "addrman->Select( true, {NET_I2P}).first == i2p_addr";
  local_198._8_8_ = (long)"addrman->Select( true, {NET_I2P}).first == i2p_addr" + 0x33;
  local_598._M_bucket_count = local_598._M_bucket_count & 0xffffffffffffff00;
  local_598._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_598._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4a8 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_598._M_element_count = (size_type)&local_198;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_158,(lazy_ostream *)&local_598,1,0,WARN,_cVar13,
             (size_t)&local_4b0,0xdd);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_148);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_4a0);
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xde;
  file_12.m_begin = (iterator)&local_4c0;
  msg_12.m_end = pvVar11;
  msg_12.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_4d0,
             msg_12);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_200._M_buckets = (__buckets_ptr)CONCAT44(local_200._M_buckets._4_4_,4);
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_4a0,&local_200,(undefined1 *)((long)&local_200._M_buckets + 4),0,local_1b0,
             local_1c0,&local_1c4);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_4a0);
  if ((local_50.__d.__r == (duration)local_90._M_next_resize) && (p_Stack_48 == p_Stack_80)) {
    bVar5 = ::operator==((CService *)&local_78,(CService *)&local_b0);
  }
  else {
    bVar5 = false;
  }
  local_158.direct[0] = bVar5;
  local_158._8_8_ = (element_type *)0x0;
  _Stack_148._M_nxt = (_Hash_node_base *)0x0;
  local_198.indirect_contents.indirect = "addrman->Select( false, {NET_I2P}).first == i2p_addr";
  local_198._8_8_ = (long)"addrman->Select( false, {NET_I2P}).first == i2p_addr" + 0x34;
  local_598._M_bucket_count = local_598._M_bucket_count & 0xffffffffffffff00;
  local_598._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_598._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4d8 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_598._M_element_count = (size_type)&local_198;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_158,(lazy_ostream *)&local_598,1,0,WARN,_cVar13,
             (size_t)&local_4e0,0xde);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_148);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_4a0);
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xdf;
  file_13.m_begin = (iterator)&local_4f0;
  msg_13.m_end = pvVar11;
  msg_13.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_500,
             msg_13);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_200._M_buckets = (__buckets_ptr)CONCAT44(local_200._M_buckets._4_4_,1);
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_4a0,&local_200,(undefined1 *)((long)&local_200._M_buckets + 4),0,local_1b0,
             local_1c0,&local_1c4);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_4a0);
  bVar5 = ::operator==((CService *)&local_78,(CService *)&local_f8.indirect_contents);
  local_158.direct[0] = bVar5;
  local_158._8_8_ = (element_type *)0x0;
  _Stack_148._M_nxt = (_Hash_node_base *)0x0;
  local_198.indirect_contents.indirect = "addrman->Select( false, {NET_IPV4}).first == addr1";
  local_198._8_8_ = (long)"addrman->Select( false, {NET_IPV4}).first == addr1" + 0x32;
  local_598._M_bucket_count = local_598._M_bucket_count & 0xffffffffffffff00;
  local_598._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_598._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_508 = "";
  local_598._M_element_count = (size_type)&local_198;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_158,(lazy_ostream *)&local_598,1,0,WARN,_cVar13,
             (size_t)&local_510,0xdf);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_148);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_4a0);
  local_78.indirect_contents.indirect = (char *)0x400000001;
  p_Var9 = &local_598;
  pppuVar10 = (undefined ***)&local_158;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_4a0,&local_78,(long)&local_78 + 8,0,p_Var9,pppuVar10,&local_198);
  local_520 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xe1;
  file_14.m_begin = (iterator)&local_520;
  msg_14.m_end = (iterator)pppuVar10;
  msg_14.m_begin = (iterator)p_Var9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_530,
             msg_14);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,local_208._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_4a0);
  bVar5 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_158.direct[0] = bVar5;
  local_158._8_8_ = (element_type *)0x0;
  _Stack_148._M_nxt = (_Hash_node_base *)0x0;
  local_198.indirect_contents.indirect =
       "addrman->Select( false, nets_with_entries).first.IsValid()";
  local_198._8_8_ = (long)"addrman->Select( false, nets_with_entries).first.IsValid()" + 0x3a;
  local_598._M_bucket_count = local_598._M_bucket_count & 0xffffffffffffff00;
  local_598._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_598._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_538 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_598._M_element_count = (size_type)&local_198;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_158,(lazy_ostream *)&local_598,1,0,WARN,_cVar13,
             (size_t)&local_540,0xe1);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_148);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
  }
  local_550 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0xe2;
  file_15.m_begin = (iterator)&local_550;
  msg_15.m_end = pvVar11;
  msg_15.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_560,
             msg_15);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_1b0._0_4_ = 2;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_598,local_1b0,local_1b0 + 4,0,local_1c0,&local_1c4,&local_599);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_598);
  bVar5 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_198.direct[0] = !bVar5;
  local_198._8_8_ = (element_type *)0x0;
  auStack_188._0_8_ = (sp_counted_base *)0x0;
  local_200._M_buckets = (__buckets_ptr)0xe3116f;
  local_200._M_bucket_count = 0xe311a3;
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
  _Stack_148._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_5b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5a8 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_140 = &local_200;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_198,(lazy_ostream *)&local_158,1,0,WARN,_cVar13,
             (size_t)&local_5b0,0xe2);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_188);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_598);
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0xe3;
  file_16.m_begin = (iterator)&local_5c0;
  msg_16.m_end = pvVar11;
  msg_16.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_5d0,
             msg_16);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_1b0._0_4_ = 3;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_598,local_1b0,local_1b0 + 4,0,local_1c0,&local_1c4,&local_599);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_598);
  bVar5 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_198.direct[0] = !bVar5;
  local_198._8_8_ = (element_type *)0x0;
  auStack_188._0_8_ = (sp_counted_base *)0x0;
  local_200._M_buckets = (__buckets_ptr)0xe311a4;
  local_200._M_bucket_count = 0xe311d9;
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
  _Stack_148._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_5e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5d8 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_140 = &local_200;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_198,(lazy_ostream *)&local_158,1,0,WARN,_cVar13,
             (size_t)&local_5e0,0xe3);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_188);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_598);
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0xe4;
  file_17.m_begin = (iterator)&local_5f0;
  msg_17.m_end = pvVar11;
  msg_17.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_600,
             msg_17);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_1b0._0_4_ = 5;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_598,(__node_base_ptr)local_1b0,local_1b0 + 4,0,local_1c0,&local_1c4,
             &local_599);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_598);
  bVar5 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_198.direct[0] = !bVar5;
  local_198._8_8_ = (element_type *)0x0;
  auStack_188._0_8_ = (sp_counted_base *)0x0;
  local_200._M_buckets = (__buckets_ptr)0xe3120e;
  local_200._M_bucket_count = 0xe31243;
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
  _Stack_148._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_608 = "";
  local_140 = &local_200;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_198,(lazy_ostream *)&local_158,1,0,WARN,_cVar13,
             (size_t)&local_610,0xe4);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_188);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_598);
  local_78.indirect_contents.indirect = (char *)0x300000002;
  local_78.indirect_contents.capacity = 5;
  pppuVar10 = (undefined ***)&local_158;
  pvVar8 = (iterator)&local_198;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_598,&local_78,(undefined1 *)((long)&local_78 + 0xc),0,pppuVar10,pvVar8,
             &local_200);
  local_620 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0xe6;
  file_18.m_begin = (iterator)&local_620;
  msg_18.m_end = pvVar8;
  msg_18.m_begin = (iterator)pppuVar10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_630,
             msg_18);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,local_208._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_598);
  bVar5 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_198.direct[0] = !bVar5;
  local_198._8_8_ = (element_type *)0x0;
  auStack_188._0_8_ = (sp_counted_base *)0x0;
  local_200._M_buckets = (__buckets_ptr)0xe3137b;
  local_200._M_bucket_count = 0xe313b9;
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_158.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
  _Stack_148._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_640 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_638 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_140 = &local_200;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_198,(lazy_ostream *)&local_158,1,0,WARN,_cVar13,
             (size_t)&local_640,0xe6);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_188);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
  }
  local_650 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_648 = "";
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0xe9;
  file_19.m_begin = (iterator)&local_650;
  msg_19.m_end = pvVar11;
  msg_19.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_660,
             msg_19);
  _Var4._M_head_impl = local_208._M_head_impl;
  tVar7 = NodeClock::now();
  bVar5 = AddrMan::Good(_Var4._M_head_impl,(CService *)&local_b0,
                        (NodeSeconds)((long)tVar7.__d.__r / 1000000000));
  local_158.direct[0] = bVar5;
  local_158._8_8_ = (element_type *)0x0;
  _Stack_148._M_nxt = (_Hash_node_base *)0x0;
  local_198.indirect_contents.indirect = "addrman->Good(i2p_addr)";
  local_198._8_8_ = (long)"addrman->Good(i2p_addr)" + 0x17;
  local_78.indirect_contents.capacity = local_78.indirect_contents.capacity & 0xffffff00;
  local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
  local_68[0] = boost::unit_test::lazy_ostream::inst;
  local_670 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_668 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  local_68[1] = (undefined1 *)&local_198;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_158,(lazy_ostream *)&local_78,1,0,WARN,_cVar13,
             (size_t)&local_670,0xe9);
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_148);
  local_680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_678 = "";
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0xeb;
  file_20.m_begin = (iterator)&local_680;
  msg_20.m_end = pvVar11;
  msg_20.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_690,
             msg_20);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_1c0._0_4_ = 4;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_158,local_1c0,local_1c0 + 4,0,&local_1c4,&local_599,&local_691);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_158);
  bVar5 = CNetAddr::IsValid((CNetAddr *)&local_78);
  local_200._M_buckets = (__buckets_ptr)CONCAT71(local_200._M_buckets._1_7_,!bVar5);
  local_200._M_bucket_count = 0;
  local_200._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1b0._0_8_ = "!addrman->Select( true, {NET_I2P}).first.IsValid()";
  local_1b0._8_8_ = "";
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
  auStack_188._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_6a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6a0 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  auStack_188._8_8_ = (__node_base_ptr)local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_200,(lazy_ostream *)&local_198,1,0,WARN,_cVar13,
             (size_t)&local_6a8,0xeb);
  boost::detail::shared_count::~shared_count((shared_count *)&local_200._M_before_begin);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_158);
  local_6b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6b0 = "";
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0xec;
  file_21.m_begin = (iterator)&local_6b8;
  msg_21.m_end = pvVar11;
  msg_21.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_6c8,
             msg_21);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_1c0._0_4_ = 4;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_158,
             (_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)local_1c0,local_1c0 + 4,0,&local_1c4,&local_599,&local_691);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_158);
  if ((local_50.__d.__r == (duration)local_90._M_next_resize) && (p_Stack_48 == p_Stack_80)) {
    bVar5 = ::operator==((CService *)&local_78,(CService *)&local_b0);
  }
  else {
    bVar5 = false;
  }
  local_200._M_buckets = (__buckets_ptr)CONCAT71(local_200._M_buckets._1_7_,bVar5);
  local_200._M_bucket_count = 0;
  local_200._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1b0._0_8_ = "addrman->Select( false, {NET_I2P}).first == i2p_addr";
  local_1b0._8_8_ = "";
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
  auStack_188._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6d0 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  auStack_188._8_8_ = (__node_base_ptr)local_1b0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_200,(lazy_ostream *)&local_198,1,0,WARN,_cVar13,
             (size_t)&local_6d8,0xec);
  boost::detail::shared_count::~shared_count((shared_count *)&local_200._M_before_begin);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_158);
  CService::CService((CService *)&local_158);
  local_130.__r = 100000000;
  p_Stack_128 = (__node_base_ptr)0x0;
  local_78.indirect_contents.indirect =
       (char *)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"c4gfnttsuwqomiygupdqqqyy5y5emnk5c73hrfvatri67prd7vyq.b32.i2p","");
  CNetAddr::SetSpecial((CNetAddr *)&local_158,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.indirect_contents.indirect !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68) {
    operator_delete(local_78.indirect_contents.indirect,(ulong)((long)local_68[0] + 1));
  }
  local_6e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_6e0 = "";
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0xf1;
  file_22.m_begin = (iterator)&local_6e8;
  msg_22.m_end = pvVar11;
  msg_22.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_6f8,
             msg_22);
  _Var4._M_head_impl = local_208._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_158);
  local_68[1] = (undefined1 *)local_140;
  local_58 = local_138;
  local_50.__d.__r = (duration)(duration)local_130.__r;
  p_Stack_48 = p_Stack_128;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_78;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_1b0,__l_01,
             (allocator_type *)&local_1c4);
  bVar5 = AddrMan::Add(_Var4._M_head_impl,(vector<CAddress,_std::allocator<CAddress>_> *)local_1b0,
                       (CNetAddr *)&local_d0.indirect_contents,(seconds)0x0);
  local_200._M_buckets = (__buckets_ptr)CONCAT71(local_200._M_buckets._1_7_,bVar5);
  local_200._M_bucket_count = 0;
  local_200._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1c0._0_8_ = "addrman->Add({i2p_addr2}, source)";
  local_1c0._8_8_ = "";
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
  auStack_188._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_708 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_700 = "";
  pvVar8 = (iterator)0x1;
  pvVar11 = (iterator)0x0;
  auStack_188._8_8_ =
       (_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        *)local_1c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_200,(lazy_ostream *)&local_198,1,0,WARN,_cVar13,
             (size_t)&local_708,0xf1);
  boost::detail::shared_count::~shared_count((shared_count *)&local_200._M_before_begin);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_1b0);
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
  }
  local_718 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_710 = "";
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0xf3;
  file_23.m_begin = (iterator)&local_718;
  msg_23.m_end = pvVar11;
  msg_23.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_728,
             msg_23);
  _Var4._M_head_impl = local_208._M_head_impl;
  local_1c4 = 4;
  std::
  _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<Network_const*>
            ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&local_198,&local_1c4,local_1c0,0,&local_599,&local_691,&local_729);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_78,_Var4._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&local_198);
  if ((local_50.__d.__r == (duration)local_130.__r) && (p_Stack_48 == p_Stack_128)) {
    bVar5 = ::operator==((CService *)&local_78,(CService *)&local_158);
  }
  else {
    bVar5 = false;
  }
  local_1b0[0] = bVar5;
  local_1b0._8_8_ = (element_type *)0x0;
  local_1b0._16_8_ = (pointer)0x0;
  local_1c0._0_8_ = "addrman->Select( true, {NET_I2P}).first == i2p_addr2";
  local_1c0._8_8_ = "";
  local_200._M_bucket_count = local_200._M_bucket_count & 0xffffffffffffff00;
  local_200._M_buckets = (__buckets_ptr)&PTR__lazy_ostream_01389048;
  local_200._M_before_begin._M_nxt = (_Hash_node_base *)boost::unit_test::lazy_ostream::inst;
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_738 = "";
  local_200._M_element_count = (size_type)local_1c0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b0,(lazy_ostream *)&local_200,1,0,WARN,_cVar13,
             (size_t)&local_740,0xf3);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1b0 + 0x10));
  if (0x10 < (uint)local_68[0]._0_4_) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_198);
  uVar12 = 0xff;
  rVar3.super_class_property<bool>.value = (class_property<bool>)false;
  rVar2.super_class_property<bool>.value = (class_property<bool>)(class_property<bool>)false;
  do {
    _Var4._M_head_impl = local_208._M_head_impl;
    local_1b0._0_4_ = 4;
    pvVar8 = local_1c0;
    pvVar11 = (iterator)&local_1c4;
    std::
    _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_Hashtable<Network_const*>
              ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&local_200,local_1b0,local_1b0 + 4,0,pvVar8,pvVar11,&local_599);
    AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                     *)&local_78,_Var4._M_head_impl,false,
                    (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                     *)&local_200);
    local_198._8_8_ = CONCAT44(local_78._12_4_,local_78.indirect_contents.capacity);
    local_198.indirect_contents.indirect = local_78.indirect_contents.indirect;
    auStack_188._0_4_ = local_68[0]._0_4_;
    local_68[0] = (undefined1 *)((ulong)local_68[0] & 0xffffffff00000000);
    auStack_188._8_8_ = local_68[1];
    local_178 = local_58;
    local_170 = local_50.__d.__r;
    p_Stack_168 = p_Stack_48;
    std::
    _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_200);
    local_750 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_748 = "";
    local_760 = &boost::unit_test::basic_cstring<char_const>::null;
    local_758 = &boost::unit_test::basic_cstring<char_const>::null;
    file_24.m_end = (iterator)0xfc;
    file_24.m_begin = (iterator)&local_750;
    msg_24.m_end = pvVar11;
    msg_24.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_760,
               msg_24);
    if ((local_170.__r == local_90._M_next_resize) && (p_Stack_168 == p_Stack_80)) {
      bVar5 = ::operator==((CService *)&local_198,(CService *)&local_b0);
      bVar6 = true;
      if (!bVar5) goto LAB_0022892a;
    }
    else {
LAB_0022892a:
      if ((local_170.__r == local_130.__r) && (p_Stack_168 == p_Stack_128)) {
        bVar6 = ::operator==((CService *)&local_198,(CService *)&local_158);
      }
      else {
        bVar6 = false;
      }
    }
    local_200._M_buckets = (__buckets_ptr)CONCAT71(local_200._M_buckets._1_7_,bVar6);
    local_200._M_bucket_count = 0;
    local_200._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1b0._0_8_ = "selected == i2p_addr || selected == i2p_addr2";
    local_1b0._8_8_ = "";
    local_78.indirect_contents.capacity = local_78.indirect_contents.capacity & 0xffffff00;
    local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
    local_68[0] = boost::unit_test::lazy_ostream::inst;
    local_68[1] = local_1b0;
    local_770 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_768 = "";
    pvVar8 = (iterator)0x2;
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_200,(lazy_ostream *)&local_78,2,0,WARN,_cVar13,
               (size_t)&local_770,0xfc);
    boost::detail::shared_count::~shared_count((shared_count *)&local_200._M_before_begin);
    if ((local_170.__r == local_90._M_next_resize) && (p_Stack_168 == p_Stack_80)) {
      bVar5 = ::operator==((CService *)&local_198,(CService *)&local_b0);
      rVar1.super_class_property<bool>.value = (class_property<bool>)(class_property<bool>)true;
      if (!bVar5) goto LAB_00228a55;
    }
    else {
LAB_00228a55:
      rVar3.super_class_property<bool>.value = (class_property<bool>)true;
      rVar1.super_class_property<bool>.value = rVar2.super_class_property<bool>.value;
    }
    if (0x10 < (uint)auStack_188._0_4_) {
      free(local_198.indirect_contents.indirect);
    }
    if ((uVar12 < 2) ||
       (uVar12 = uVar12 - 1,
       rVar2.super_class_property<bool>.value = rVar1.super_class_property<bool>.value,
       (bool)((byte)rVar3.super_class_property<bool>.value &
             (byte)rVar1.super_class_property<bool>.value))) {
      local_780 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_778 = "";
      local_790 = &boost::unit_test::basic_cstring<char_const>::null;
      local_788 = &boost::unit_test::basic_cstring<char_const>::null;
      file_25.m_end = (iterator)0x104;
      file_25.m_begin = (iterator)&local_780;
      msg_25.m_end = pvVar11;
      msg_25.m_begin = pvVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_790,
                 msg_25);
      local_198._8_8_ = (element_type *)0x0;
      auStack_188._0_8_ = (sp_counted_base *)0x0;
      local_200._M_buckets = (__buckets_ptr)0xe314c7;
      local_200._M_bucket_count = 0xe314d3;
      local_78.indirect_contents.capacity = local_78.indirect_contents.capacity & 0xffffff00;
      local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
      local_68[0] = boost::unit_test::lazy_ostream::inst;
      local_7a0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_798 = "";
      pvVar8 = (iterator)0x1;
      pvVar11 = (iterator)0x0;
      local_68[1] = (undefined1 *)&local_200;
      local_198.direct[0] = (char)rVar3.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_198,(lazy_ostream *)&local_78,1,0,WARN,_cVar13,
                 (size_t)&local_7a0,0x104);
      boost::detail::shared_count::~shared_count((shared_count *)auStack_188);
      local_7b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_7a8 = "";
      local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_26.m_end = (iterator)0x105;
      file_26.m_begin = (iterator)&local_7b0;
      msg_26.m_end = pvVar11;
      msg_26.m_begin = pvVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_7c0,
                 msg_26);
      local_198.direct[0] = (char)rVar1.super_class_property<bool>.value;
      local_198._8_8_ = (element_type *)0x0;
      auStack_188._0_8_ = (sp_counted_base *)0x0;
      local_200._M_buckets = (__buckets_ptr)0xe314d4;
      local_200._M_bucket_count = 0xe314e2;
      local_78.indirect_contents.capacity = local_78.indirect_contents.capacity & 0xffffff00;
      local_78.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
      local_68[0] = boost::unit_test::lazy_ostream::inst;
      local_68[1] = (undefined1 *)&local_200;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_198,(lazy_ostream *)&local_78,1,0,WARN,0xe30a79,
                 (size_t)&stack0xfffffffffffff830,0x105);
      boost::detail::shared_count::~shared_count((shared_count *)auStack_188);
      if (0x10 < (uint)_Stack_148._M_nxt) {
        free(local_158.indirect_contents.indirect);
      }
      std::
      _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_598);
      std::
      _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_4a0);
      if (0x10 < (uint)local_a0._M_nxt) {
        free(local_b0.indirect_contents.indirect);
      }
      if (0x10 < local_e8) {
        free(local_f8.indirect_contents.indirect);
      }
      if (0x10 < local_c0) {
        free(local_d0.indirect_contents.indirect);
      }
      std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
                ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)&local_208);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_select_by_network)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    BOOST_CHECK(!addrman->Select(/*new_only=*/true, {NET_IPV4}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_IPV4}).first.IsValid());

    // add ipv4 address to the new table
    CNetAddr source = ResolveIP("252.2.2.2");
    CService addr1 = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));

    BOOST_CHECK(addrman->Select(/*new_only=*/true, {NET_IPV4}).first == addr1);
    BOOST_CHECK(addrman->Select(/*new_only=*/false, {NET_IPV4}).first == addr1);
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_IPV6}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_ONION}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_I2P}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_CJDNS}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/true, {NET_CJDNS}).first.IsValid());
    BOOST_CHECK(addrman->Select(/*new_only=*/false).first == addr1);

    // add I2P address to the new table
    CAddress i2p_addr;
    i2p_addr.SetSpecial("udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.i2p");
    BOOST_CHECK(addrman->Add({i2p_addr}, source));

    BOOST_CHECK(addrman->Select(/*new_only=*/true, {NET_I2P}).first == i2p_addr);
    BOOST_CHECK(addrman->Select(/*new_only=*/false, {NET_I2P}).first == i2p_addr);
    BOOST_CHECK(addrman->Select(/*new_only=*/false, {NET_IPV4}).first == addr1);
    std::unordered_set<Network> nets_with_entries = {NET_IPV4, NET_I2P};
    BOOST_CHECK(addrman->Select(/*new_only=*/false, nets_with_entries).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_IPV6}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_ONION}).first.IsValid());
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, {NET_CJDNS}).first.IsValid());
    std::unordered_set<Network> nets_without_entries = {NET_IPV6, NET_ONION, NET_CJDNS};
    BOOST_CHECK(!addrman->Select(/*new_only=*/false, nets_without_entries).first.IsValid());

    // bump I2P address to tried table
    BOOST_CHECK(addrman->Good(i2p_addr));

    BOOST_CHECK(!addrman->Select(/*new_only=*/true, {NET_I2P}).first.IsValid());
    BOOST_CHECK(addrman->Select(/*new_only=*/false, {NET_I2P}).first == i2p_addr);

    // add another I2P address to the new table
    CAddress i2p_addr2;
    i2p_addr2.SetSpecial("c4gfnttsuwqomiygupdqqqyy5y5emnk5c73hrfvatri67prd7vyq.b32.i2p");
    BOOST_CHECK(addrman->Add({i2p_addr2}, source));

    BOOST_CHECK(addrman->Select(/*new_only=*/true, {NET_I2P}).first == i2p_addr2);

    // ensure that both new and tried table are selected from
    bool new_selected{false};
    bool tried_selected{false};
    int counter = 256;

    while (--counter > 0 && (!new_selected || !tried_selected)) {
        const CAddress selected{addrman->Select(/*new_only=*/false, {NET_I2P}).first};
        BOOST_REQUIRE(selected == i2p_addr || selected == i2p_addr2);
        if (selected == i2p_addr) {
            tried_selected = true;
        } else {
            new_selected = true;
        }
    }

    BOOST_CHECK(new_selected);
    BOOST_CHECK(tried_selected);
}